

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O1

string * __thiscall
ROM::Description::description_abi_cxx11_(string *__return_storage_ptr__,Description *this,int flags)

{
  pointer pbVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name;
  pointer pbVar7;
  char *pcVar8;
  uint uVar9;
  _Rb_tree_header *p_Var10;
  bool bVar11;
  stringstream output;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar9 = flags & 0xfffffffd;
  if ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar9 = flags;
  }
  if ((uVar9 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->descriptive_name)._M_dataplus._M_p,
               (this->descriptive_name)._M_string_length);
    if (uVar9 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
LAB_003bfc46:
      if ((uVar9 & 1) != 0) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes",6);
        uVar3 = uVar9 & 0xfffffffa;
        uVar9 = uVar9 & 0xfffffffa;
        if (uVar3 == 0) goto LAB_003bfdaf;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
      }
      if ((uVar9 & 2) != 0) {
        bVar11 = (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2;
        pcVar8 = "usual crc32: ";
        if (!bVar11) {
          pcVar8 = "usual crc32s: ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar8,0xe - (ulong)bVar11);
        p_Var6 = (this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var10 = &(this->crc32s)._M_t._M_impl.super__Rb_tree_header;
        local_1c0 = __return_storage_ptr__;
        if ((_Rb_tree_header *)p_Var6 != p_Var10) {
          bVar11 = true;
          do {
            if (!bVar11) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            lVar2 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar2 + 1] == '\0') {
              cVar4 = std::ios::widen((char)(ostream *)local_1a8 + (char)lVar2);
              acStack_c8[lVar2] = cVar4;
              acStack_c8[lVar2 + 1] = '\x01';
            }
            acStack_c8[lVar2] = '0';
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            bVar11 = false;
          } while ((_Rb_tree_header *)p_Var6 != p_Var10);
        }
        __return_storage_ptr__ = local_1c0;
        if ((uVar9 & 0xfffffffd) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__cxx11::stringbuf::str();
          goto LAB_003bfdd0;
        }
      }
    }
  }
  else {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->machine_name)._M_dataplus._M_p,
                        (this->machine_name)._M_string_length);
    local_1c1 = '/';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1c1,1);
    pbVar7 = (this->file_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->file_names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 == 0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      pbVar7 = (this->file_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->file_names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1c0 = __return_storage_ptr__;
      if (pbVar7 != pbVar1) {
        bVar11 = true;
        do {
          if (!bVar11) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," or ",4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
          pbVar7 = pbVar7 + 1;
          bVar11 = false;
        } while (pbVar7 != pbVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
      __return_storage_ptr__ = local_1c0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->descriptive_name)._M_dataplus._M_p,
               (this->descriptive_name)._M_string_length);
    uVar3 = uVar9 & 0xfffffffb;
    uVar9 = uVar9 & 0xfffffffb;
    if (uVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
      goto LAB_003bfc46;
    }
LAB_003bfdaf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  }
  std::__cxx11::stringbuf::str();
LAB_003bfdd0:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Description::description(int flags) const {
	std::stringstream output;

	// If there are no CRCs, don't output them.
	if(crc32s.empty()) flags &= ~DescriptionFlag::CRC;

	// Print the file name(s) and the descriptive name.
	if(flags & DescriptionFlag::Filename) {
		flags &= ~DescriptionFlag::Filename;

		output << machine_name << '/';
		if(file_names.size() == 1) {
			output << file_names[0];
		} else {
			output << "{";
			bool is_first = true;
			for(const auto &file_name: file_names) {
				if(!is_first) output << " or ";
				output << file_name;
				is_first = false;
			}
			output << "}";
		}
		output << " (" << descriptive_name;
		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	} else {
		output << descriptive_name;
		if(!flags) {
			return output.str();
		}
		output << " (";
	}

	// Print the size.
	if(flags & DescriptionFlag::Size) {
		flags &= ~DescriptionFlag::Size;
		output << size << " bytes";

		if(!flags) {
			output << ")";
			return output.str();
		}
		output << "; ";
	}

	// Print the CRC(s).
	if(flags & DescriptionFlag::CRC) {
		flags &= ~DescriptionFlag::CRC;

		output << ((crc32s.size() > 1) ? "usual crc32s: " : "usual crc32: ");
		bool is_first = true;
		for(const auto crc32: crc32s) {
			if(!is_first) output << ", ";
			is_first = false;
			output << std::hex << std::setfill('0') << std::setw(8) << crc32;
		}

		if(!flags) {
			output << ")";
			return output.str();
		}
	}

	return output.str();
}